

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode Curl_proxy_connect(connectdata *conn,int sockindex)

{
  Curl_easy *pCVar1;
  Curl_easy *pCVar2;
  void *pvVar3;
  uint uVar4;
  CURLcode CVar5;
  char *hostname;
  _Bool *done;
  HTTP http_proxy;
  
  pCVar1 = conn->data;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     ((conn->bits).proxy_ssl_connected[sockindex] == false)) {
    done = (conn->bits).proxy_ssl_connected + sockindex;
    CVar5 = Curl_ssl_connect_nonblocking(conn,sockindex,done);
    if (CVar5 != CURLE_OK) {
      Curl_conncontrol(conn,1);
      return CVar5;
    }
    if ((*done & 1U) == 0) {
      return CURLE_OK;
    }
  }
  if ((~*(uint *)&(conn->bits).field_0x4 & 9) != 0) {
    return CURLE_OK;
  }
  pCVar2 = conn->data;
  pvVar3 = (pCVar2->req).protop;
  memset(&http_proxy,0,0x238);
  (pCVar2->req).protop = &http_proxy;
  Curl_conncontrol(conn,0);
  uVar4 = (uint)*(undefined8 *)&(conn->bits).field_0x4;
  if ((uVar4 >> 8 & 1) == 0) {
    if (sockindex != 1) {
      hostname = (conn->host).name;
LAB_00126cad:
      if ((uVar4 >> 9 & 1) == 0) {
        uVar4 = conn->remote_port;
      }
      else {
        uVar4 = conn->conn_to_port;
      }
      goto LAB_00126cc1;
    }
    hostname = conn->secondaryhostname;
  }
  else {
    hostname = (conn->conn_to_host).name;
    if (sockindex != 1) goto LAB_00126cad;
  }
  uVar4 = (uint)conn->secondary_port;
LAB_00126cc1:
  CVar5 = Curl_proxyCONNECT(conn,sockindex,hostname,uVar4);
  (conn->data->req).protop = pvVar3;
  if (CVar5 == CURLE_OK) {
    (*Curl_cfree)((pCVar1->state).aptr.proxyuserpwd);
    (pCVar1->state).aptr.proxyuserpwd = (char *)0x0;
    return CURLE_OK;
  }
  return CVar5;
}

Assistant:

CURLcode Curl_proxy_connect(struct connectdata *conn, int sockindex)
{
  struct Curl_easy *data = conn->data;
  if(conn->http_proxy.proxytype == CURLPROXY_HTTPS) {
    const CURLcode result = https_proxy_connect(conn, sockindex);
    if(result)
      return result;
    if(!conn->bits.proxy_ssl_connected[sockindex])
      return result; /* wait for HTTPS proxy SSL initialization to complete */
  }

  if(conn->bits.tunnel_proxy && conn->bits.httpproxy) {
#ifndef CURL_DISABLE_PROXY
    /* for [protocol] tunneled through HTTP proxy */
    struct HTTP http_proxy;
    void *prot_save;
    const char *hostname;
    int remote_port;
    CURLcode result;

    /* BLOCKING */
    /* We want "seamless" operations through HTTP proxy tunnel */

    /* Curl_proxyCONNECT is based on a pointer to a struct HTTP at the
     * member conn->proto.http; we want [protocol] through HTTP and we have
     * to change the member temporarily for connecting to the HTTP
     * proxy. After Curl_proxyCONNECT we have to set back the member to the
     * original pointer
     *
     * This function might be called several times in the multi interface case
     * if the proxy's CONNECT response is not instant.
     */
    prot_save = conn->data->req.protop;
    memset(&http_proxy, 0, sizeof(http_proxy));
    conn->data->req.protop = &http_proxy;
    connkeep(conn, "HTTP proxy CONNECT");

    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */

    if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else if(sockindex == SECONDARYSOCKET)
      hostname = conn->secondaryhostname;
    else
      hostname = conn->host.name;

    if(sockindex == SECONDARYSOCKET)
      remote_port = conn->secondary_port;
    else if(conn->bits.conn_to_port)
      remote_port = conn->conn_to_port;
    else
      remote_port = conn->remote_port;
    result = Curl_proxyCONNECT(conn, sockindex, hostname, remote_port);
    conn->data->req.protop = prot_save;
    if(CURLE_OK != result)
      return result;
    Curl_safefree(data->state.aptr.proxyuserpwd);
#else
    return CURLE_NOT_BUILT_IN;
#endif
  }
  /* no HTTP tunnel proxy, just return */
  return CURLE_OK;
}